

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.h
# Opt level: O2

tommy_hashlin_node * tommy_hashlin_bucket(tommy_hashlin *hashlin,tommy_hash_t hash)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  
  uVar2 = hashlin->low_mask & hash;
  if (uVar2 < hashlin->split) {
    uVar2 = hash & hashlin->bucket_mask;
  }
  uVar1 = 0x1f;
  if ((uVar2 | 1) != 0) {
    for (; (uVar2 | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return hashlin->bucket[uVar1][uVar2];
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline tommy_hashlin_node* tommy_hashlin_bucket(tommy_hashlin* hashlin, tommy_hash_t hash)
{
	return *tommy_hashlin_bucket_ref(hashlin, hash);
}